

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoll.c
# Opt level: O0

int ffpclx(fitsfile *fptr,int colnum,LONGLONG frow,long fbit,long nbit,char *larray,int *status)

{
  bool bVar1;
  int iVar2;
  LONGLONG *startpos;
  int *maxelem_00;
  long lVar3;
  FITSfile *pFVar4;
  long lVar5;
  FITSfile *pFVar6;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  fitsfile *in_stack_00000008;
  tcolumn *colptr;
  LONGLONG lrepeat;
  LONGLONG heapoffset;
  uchar cbuff;
  char snull [12];
  char tform [12];
  double dummyd;
  int hdutype;
  int maxelem;
  int descrp;
  int tcode;
  long incre;
  long twidth;
  long ii;
  long ndone;
  long bitloc;
  long nbyte;
  long lbyte;
  long fbyte;
  LONGLONG tnull;
  LONGLONG estart;
  LONGLONG rstart;
  LONGLONG elemnum;
  LONGLONG rowlen;
  LONGLONG repeat;
  LONGLONG bstart;
  LONGLONG offset;
  int *status_00;
  undefined1 *puVar7;
  undefined1 *bytepos;
  fitsfile *fptr_00;
  int *status_01;
  LONGLONG *heapaddr;
  LONGLONG *length;
  undefined1 *rownum;
  int *status_02;
  fitsfile *fptr_01;
  int *status_03;
  fitsfile *fptr_02;
  int *in_stack_fffffffffffffe80;
  undefined1 *nbytes;
  int *in_stack_fffffffffffffe88;
  fitsfile *fptr_03;
  int in_stack_fffffffffffffe94;
  fitsfile *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffee4;
  LONGLONG in_stack_fffffffffffffee8;
  LONGLONG in_stack_fffffffffffffef0;
  LONGLONG in_stack_fffffffffffffef8;
  int local_100;
  int in_stack_ffffffffffffff04;
  fitsfile *in_stack_ffffffffffffff08;
  int local_ec;
  undefined1 local_e8 [8];
  double *in_stack_ffffffffffffff20;
  fitsfile *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  long lVar8;
  long *in_stack_ffffffffffffff38;
  LONGLONG *in_stack_ffffffffffffff58;
  FITSfile *in_stack_ffffffffffffff60;
  LONGLONG *in_stack_ffffffffffffff68;
  LONGLONG *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  FITSfile *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int local_34;
  
  if (in_stack_00000008->HDUposition < 1) {
    if (in_R8 < 1) {
      local_34 = in_stack_00000008->HDUposition;
    }
    else if (in_RDX < 1) {
      in_stack_00000008->HDUposition = 0x133;
      local_34 = 0x133;
    }
    else if (in_RCX < 1) {
      in_stack_00000008->HDUposition = 0x134;
      local_34 = 0x134;
    }
    else {
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
           (iVar2 = ffrdef(in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20), 0 < iVar2))
        {
          return in_stack_00000008->HDUposition;
        }
      }
      else {
        ffmahd(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80);
      }
      startpos = (LONGLONG *)((in_RCX + 7) / 8);
      maxelem_00 = (int *)((in_RCX + in_R8 + 6) / 8);
      puVar7 = &stack0xfffffffffffffef4;
      nbytes = &stack0xfffffffffffffee8;
      status_00 = &local_100;
      bytepos = &stack0xffffffffffffff20;
      fptr_00 = (fitsfile *)&local_ec;
      status_01 = (int *)&stack0xffffffffffffff0c;
      heapaddr = (LONGLONG *)&stack0xffffffffffffff88;
      length = (LONGLONG *)&stack0xffffffffffffff70;
      rownum = local_e8;
      status_02 = (int *)&stack0xffffffffffffff80;
      fptr_01 = (fitsfile *)&stack0xffffffffffffff78;
      status_03 = (int *)&stack0xffffffffffffff08;
      fptr_02 = (fitsfile *)&stack0xffffffffffffff58;
      fptr_03 = in_stack_00000008;
      iVar2 = ffgcprll(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8
                       ,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       in_stack_fffffffffffffee4,in_stack_ffffffffffffff20,
                       (double *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff38,(int *)((long)maxelem_00 + (1 - (long)startpos)),
                       maxelem_00,startpos,in_stack_ffffffffffffff58,
                       (long *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                       in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                       (LONGLONG *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                       *(int **)(*(long *)(in_RDI + 2) + 0x3e0));
      if (iVar2 < 1) {
        lVar3 = in_RCX + -1 + ((in_RCX + -1) / 8) * -8;
        lVar8 = 0;
        pFVar4 = (FITSfile *)((long)startpos + -1);
        lVar5 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
        local_ec = *(int *)(lVar5 + 0x50);
        iVar2 = local_ec;
        if (local_ec < 1) {
          iVar2 = -local_ec;
        }
        if (iVar2 < 0xc) {
          if (local_ec < 1) {
            bVar1 = true;
            pFVar6 = (FITSfile *)(in_RCX + in_R8 + -1);
            if (local_ec == -1) {
              ffgdesll(fptr_01,(int)((ulong)status_02 >> 0x20),(LONGLONG)rownum,length,heapaddr,
                       status_01);
              ffpdes(fptr_01,(int)((ulong)status_02 >> 0x20),(LONGLONG)rownum,(LONGLONG)length,
                     (LONGLONG)heapaddr,status_01);
            }
          }
          else {
            bVar1 = false;
            pFVar6 = *(FITSfile **)(lVar5 + 0x58);
            if (local_ec == 1) {
              pFVar6 = (FITSfile *)((long)((long)&pFVar6->driver + 3) / 8);
            }
            if ((long)pFVar6 < (long)startpos) {
              in_stack_00000008->HDUposition = 0x134;
              return 0x134;
            }
          }
          ffmbyt(fptr_00,(LONGLONG)bytepos,(int)((ulong)puVar7 >> 0x20),status_00);
          while( true ) {
            iVar2 = ffgbyt(fptr_02,(LONGLONG)status_03,fptr_01,status_02);
            if (iVar2 == 0x6b) {
              in_stack_00000008->HDUposition = 0;
            }
            ffmbyt(fptr_00,(LONGLONG)bytepos,(int)((ulong)puVar7 >> 0x20),status_00);
            for (; lVar3 < 8 && lVar8 < in_R8; lVar3 = lVar3 + 1) {
              lVar8 = lVar8 + 1;
            }
            ffpbyt(fptr_03,(LONGLONG)nbytes,fptr_02,status_03);
            if (lVar8 == in_R8) break;
            if ((!bVar1) && (pFVar4 = (FITSfile *)((long)&pFVar4->filehandle + 1), pFVar4 == pFVar6)
               ) {
              pFVar4 = (FITSfile *)0x0;
              ffmbyt(fptr_00,(LONGLONG)bytepos,(int)((ulong)puVar7 >> 0x20),status_00);
            }
            lVar3 = 0;
          }
          local_34 = in_stack_00000008->HDUposition;
        }
        else {
          in_stack_00000008->HDUposition = 0x136;
          local_34 = 0x136;
        }
      }
      else {
        local_34 = in_stack_00000008->HDUposition;
      }
    }
  }
  else {
    local_34 = in_stack_00000008->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpclx( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            long  fbit,      /* I - first bit to write (1 = 1st)            */
            long  nbit,      /* I - number of bits to write                 */
            char *larray,    /* I - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  write an array of logical values to a specified bit or byte
  column of the binary table.   If larray is TRUE, then the corresponding
  bit is set to 1, otherwise it is set to 0.
  The binary table column being written to must have datatype 'B' or 'X'. 
*/
{
    LONGLONG offset, bstart, repeat, rowlen, elemnum, rstart, estart, tnull;
    long fbyte, lbyte, nbyte, bitloc, ndone;
    long ii, twidth, incre;
    int tcode, descrp, maxelem, hdutype;
    double dummyd;
    char tform[12], snull[12];
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    static unsigned char offbit[8] = {127, 191, 223, 239, 247, 251, 253, 254};
    LONGLONG heapoffset, lrepeat;
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (fbit + 7) / 8;
    lbyte = (fbit + nbit + 6) / 8;
    nbyte = lbyte - fbyte +1;

    /* Save the current heapsize; ffgcprll will increment the value if */
    /* we are writing to a variable length column. */
    offset = (fptr->Fptr)->heapsize;

    /* call ffgcprll in case we are writing beyond the current end of   */
    /* the table; it will allocate more space and shift any following */
    /* HDU's.  Otherwise, we have little use for most of the returned */
    /* parameters, therefore just use dummy parameters.               */

    if (ffgcprll( fptr, colnum, frow, fbyte, nbyte, 1, &dummyd, &dummyd,
        tform, &twidth, &tcode, &maxelem, &bstart, &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    bitloc = fbit - 1 - ((fbit - 1) / 8 * 8);
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        repeat = colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8; /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        repeat = fbit + nbit -1;

        /* write the number of elements and the starting offset.    */
        /* Note: ffgcprll previous wrote the descripter, but with the */
        /* wrong repeat value  (gave bytes instead of bits).        */
        /* Make sure to not change the current heap offset value!  */

        if (tcode == -TBIT) {
            ffgdesll(fptr, colnum, frow, &lrepeat, &heapoffset, status);
            ffpdes(  fptr, colnum, frow, (long) repeat, heapoffset, status);
	}

        /* Calc the i/o pointer location to start of sequence of pixels.   */
        /* ffgcprll has already calculated a value for bstart that         */
        /* points to the first element of the vector; we just have to      */
        /* increment it to point to the first element we want to write to. */
        /* Note: ffgcprll also already updated the size of the heap, so we */
        /* don't have to do that again here.                               */

        bstart += estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    ffmbyt(fptr, bstart, IGNORE_EOF, status);

    /* read the next byte (we may only be modifying some of the bits) */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) == END_OF_FILE)
      {
        /* hit end of file trying to read the byte, so just set byte = 0 */
        *status = 0;
        cbuff = 0;
      }

      /* move back, to be able to overwrite the byte */
      ffmbyt(fptr, bstart, IGNORE_EOF, status);
 
      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(larray[ndone])
          cbuff = cbuff | onbit[ii];
        else
          cbuff = cbuff & offbit[ii];
      }

      ffpbyt(fptr, 1, &cbuff, status); /* write the modified byte */
      if (ndone == nbit)  /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      bstart++;
      if (!descrp)
      {
        estart++;
        if (estart == repeat)
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, IGNORE_EOF, status);
        }
      }
      bitloc = 0;
    }
}